

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O1

int mbedtls_ecp_check_pubkey(mbedtls_ecp_group *grp,mbedtls_ecp_point *pt)

{
  mbedtls_mpi *X;
  mbedtls_mpi *Y;
  mbedtls_mpi_uint *pmVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  mbedtls_mpi YY;
  mbedtls_mpi local_60;
  mbedtls_mpi local_48;
  
  iVar2 = mbedtls_mpi_cmp_int(&pt->Z,1);
  if (iVar2 != 0) {
    return -0x4c80;
  }
  pmVar1 = (grp->G).X.p;
  if (pmVar1 == (mbedtls_mpi_uint *)0x0) {
    return -0x4f80;
  }
  if ((grp->G).Y.p == (mbedtls_mpi_uint *)0x0) {
    sVar4 = mbedtls_mpi_size(&pt->X);
    if (grp->nbits + 7 >> 3 < sVar4) {
      return -0x4c80;
    }
    return 0;
  }
  if (pmVar1 == (mbedtls_mpi_uint *)0x0) {
    return -0x4f80;
  }
  if ((grp->G).Y.p == (mbedtls_mpi_uint *)0x0) {
    return -0x4f80;
  }
  iVar2 = mbedtls_mpi_cmp_int(&pt->X,0);
  if (iVar2 < 0) {
    return -0x4c80;
  }
  X = &pt->Y;
  iVar2 = mbedtls_mpi_cmp_int(X,0);
  if (iVar2 < 0) {
    return -0x4c80;
  }
  Y = &grp->P;
  iVar2 = mbedtls_mpi_cmp_mpi(&pt->X,Y);
  if (-1 < iVar2) {
    return -0x4c80;
  }
  iVar2 = mbedtls_mpi_cmp_mpi(X,Y);
  if (-1 < iVar2) {
    return -0x4c80;
  }
  mbedtls_mpi_init(&local_48);
  mbedtls_mpi_init(&local_60);
  iVar2 = mbedtls_mpi_mul_mpi(&local_48,X,X);
  if ((iVar2 == 0) && (iVar2 = ecp_modp(&local_48,grp), iVar2 == 0)) {
    mul_count = mul_count + 1;
    iVar2 = mbedtls_mpi_mul_mpi(&local_60,&pt->X,&pt->X);
    if ((iVar2 == 0) && (iVar2 = ecp_modp(&local_60,grp), iVar2 == 0)) {
      mul_count = mul_count + 1;
      if ((grp->A).p == (mbedtls_mpi_uint *)0x0) {
        iVar2 = mbedtls_mpi_sub_int(&local_60,&local_60,3);
        if (iVar2 == 0) {
          do {
            if ((-1 < local_60.s) || (iVar2 = mbedtls_mpi_cmp_int(&local_60,0), iVar2 == 0))
            goto LAB_0017fb30;
            iVar2 = mbedtls_mpi_add_mpi(&local_60,&local_60,Y);
          } while (iVar2 == 0);
        }
      }
      else {
        iVar2 = mbedtls_mpi_add_mpi(&local_60,&local_60,&grp->A);
        if (iVar2 == 0) {
          do {
            iVar2 = mbedtls_mpi_cmp_mpi(&local_60,Y);
            if (iVar2 < 0) goto LAB_0017fb30;
            iVar2 = mbedtls_mpi_sub_abs(&local_60,&local_60,Y);
          } while (iVar2 == 0);
        }
      }
    }
  }
  goto LAB_0017fa51;
LAB_0017fb30:
  iVar2 = mbedtls_mpi_mul_mpi(&local_60,&local_60,&pt->X);
  if ((iVar2 == 0) && (iVar2 = ecp_modp(&local_60,grp), iVar2 == 0)) {
    mul_count = mul_count + 1;
    iVar2 = mbedtls_mpi_add_mpi(&local_60,&local_60,&grp->B);
    if (iVar2 == 0) {
      do {
        iVar2 = mbedtls_mpi_cmp_mpi(&local_60,Y);
        if (iVar2 < 0) {
          iVar3 = mbedtls_mpi_cmp_mpi(&local_48,&local_60);
          iVar2 = -0x4c80;
          if (iVar3 == 0) {
            iVar2 = 0;
          }
          break;
        }
        iVar2 = mbedtls_mpi_sub_abs(&local_60,&local_60,Y);
      } while (iVar2 == 0);
    }
  }
LAB_0017fa51:
  mbedtls_mpi_free(&local_48);
  mbedtls_mpi_free(&local_60);
  return iVar2;
}

Assistant:

int mbedtls_ecp_check_pubkey( const mbedtls_ecp_group *grp, const mbedtls_ecp_point *pt )
{
    /* Must use affine coordinates */
    if( mbedtls_mpi_cmp_int( &pt->Z, 1 ) != 0 )
        return( MBEDTLS_ERR_ECP_INVALID_KEY );

#if defined(ECP_MONTGOMERY)
    if( ecp_get_type( grp ) == ECP_TYPE_MONTGOMERY )
        return( ecp_check_pubkey_mx( grp, pt ) );
#endif
#if defined(ECP_SHORTWEIERSTRASS)
    if( ecp_get_type( grp ) == ECP_TYPE_SHORT_WEIERSTRASS )
        return( ecp_check_pubkey_sw( grp, pt ) );
#endif
    return( MBEDTLS_ERR_ECP_BAD_INPUT_DATA );
}